

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseJsonName
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  LocationRecorder *in_RDI;
  LocationRecorder value_location;
  LocationRecorder location;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  LocationRecorder *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  Parser *in_stack_ffffffffffffff50;
  LocationRecorder *this_00;
  allocator *in_stack_ffffffffffffff58;
  Parser *in_stack_ffffffffffffff88;
  SourceCodeInfo *in_stack_ffffffffffffff90;
  Parser *in_stack_ffffffffffffff98;
  allocator local_49;
  string local_48 [8];
  char *in_stack_ffffffffffffffc0;
  Parser *in_stack_ffffffffffffffc8;
  bool local_1;
  
  bVar1 = FieldDescriptorProto::has_json_name((FieldDescriptorProto *)0x60fc21);
  if (bVar1) {
    in_stack_ffffffffffffff58 = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,"Already set option \"json_name\".",in_stack_ffffffffffffff58);
    AddError(in_stack_ffffffffffffff50,
             (string *)
             CONCAT17(in_stack_ffffffffffffff4f,
                      CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    FieldDescriptorProto::clear_json_name((FieldDescriptorProto *)in_stack_ffffffffffffff50);
  }
  this_00 = (LocationRecorder *)&stack0xffffffffffffff88;
  LocationRecorder::LocationRecorder
            (this_00,(LocationRecorder *)
                     CONCAT17(in_stack_ffffffffffffff4f,
                              CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)),
             (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  LocationRecorder::RecordLegacyLocation
            (in_RDI,(Message *)in_stack_ffffffffffffff58,(ErrorLocation)((ulong)this_00 >> 0x20));
  bVar1 = Consume(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (bVar1) {
    bVar1 = Consume(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (bVar1) {
      LocationRecorder::LocationRecorder
                (in_stack_ffffffffffffff40,
                 (LocationRecorder *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      LocationRecorder::RecordLegacyLocation
                (in_RDI,(Message *)in_stack_ffffffffffffff58,(ErrorLocation)((ulong)this_00 >> 0x20)
                );
      FieldDescriptorProto::mutable_json_name_abi_cxx11_((FieldDescriptorProto *)0x60fdb7);
      local_1 = ConsumeString(in_stack_ffffffffffffff98,(string *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
      LocationRecorder::~LocationRecorder(this_00);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  LocationRecorder::~LocationRecorder(this_00);
  return local_1;
}

Assistant:

bool Parser::ParseJsonName(FieldDescriptorProto* field,
                           const LocationRecorder& field_location,
                           const FileDescriptorProto* containing_file) {
  if (field->has_json_name()) {
    AddError("Already set option \"json_name\".");
    field->clear_json_name();
  }

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kJsonNameFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::OPTION_NAME);

  DO(Consume("json_name"));
  DO(Consume("="));

  LocationRecorder value_location(location);
  value_location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::OPTION_VALUE);

  DO(ConsumeString(field->mutable_json_name(),
                   "Expected string for JSON name."));
  return true;
}